

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O1

void __thiscall JsonObject_BadNestedObject_Test::TestBody(JsonObject_BadNestedObject_Test *this)

{
  error_category *peVar1;
  parser<pstore::json::null_output> *this_00;
  char *message;
  AssertionResult gtest_ar;
  parser<pstore::json::null_output> p;
  AssertHelper AStack_e8;
  error_category *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  long local_d0 [2];
  error_code local_c0;
  parser<pstore::json::null_output> local_b0;
  
  pstore::json::parser<pstore::json::null_output>::parser(&local_b0,0);
  local_e0 = (error_category *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"{\"a\":nu}","");
  peVar1 = local_e0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_c0,(index_type)local_d8);
  local_c0._M_cat = peVar1;
  this_00 = pstore::json::parser<pstore::json::null_output>::
            input<pstore::gsl::span<char_const,_1l>>(&local_b0,(span<const_char,__1L> *)&local_c0);
  pstore::json::parser<pstore::json::null_output>::eof(this_00);
  if (local_e0 != (error_category *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  local_c0._M_cat = pstore::json::get_error_category();
  local_c0._M_value = 0xb;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_e0,"p.last_error ()",
             "make_error_code (json::error_code::unrecognized_token)",&local_b0.error_,&local_c0);
  if (local_e0._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0xbe,message);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    if ((long *)local_c0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c0._0_8_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.string_._M_dataplus._M_p != &local_b0.string_.field_2) {
    operator_delete(local_b0.string_._M_dataplus._M_p,
                    local_b0.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>_>_>
  ::~deque(&local_b0.stack_.c);
  if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
       )local_b0.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
        ._M_head_impl != (singleton_storage<pstore::json::null_output> *)0x0) {
    operator_delete((void *)local_b0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonObject, BadNestedObject) {
    json::parser<json::null_output> p;
    p.input (std::string{"{\"a\":nu}"}).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unrecognized_token));
}